

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetNrStateFactorInstantiations
          (MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  Scope *in_RSI;
  
  GetNrStateFactorInstantiations
            ((MultiAgentDecisionProcessDiscreteFactoredStates *)
             (&(this->super_MultiAgentDecisionProcess).field_0x0 +
             *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x1f0)),in_RSI);
  return;
}

Assistant:

size_t MultiAgentDecisionProcessDiscreteFactoredStates::GetNrStateFactorInstantiations(const Scope& sfScope) const
{
    if(sfScope.size()>0)
    {
        const vector<size_t>& nrSFvals = GetNrValuesPerFactor();
        vector<size_t> restr_nrSFvals(sfScope.size());
        IndexTools::RestrictIndividualIndicesToScope( nrSFvals, sfScope, restr_nrSFvals );
        size_t restr_nrJSFvals = VectorTools::VectorProduct(restr_nrSFvals);
        return restr_nrJSFvals;
    }
    else
        return(0);
}